

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O0

vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_> * __thiscall
QPDFAcroFormDocumentHelper::getFormFields
          (vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>
           *__return_storage_ptr__,QPDFAcroFormDocumentHelper *this)

{
  bool bVar1;
  element_type *peVar2;
  QPDFObjectHandle local_50;
  reference local_40;
  pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
  *iter;
  iterator __end1;
  iterator __begin1;
  map<QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>_>
  *__range1;
  QPDFAcroFormDocumentHelper *this_local;
  vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_> *result;
  
  analyze(this);
  std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>::vector
            (__return_storage_ptr__);
  peVar2 = std::
           __shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m);
  __end1 = std::
           map<QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>_>
           ::begin(&peVar2->field_to_annotations);
  iter = (pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
          *)std::
            map<QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>_>
            ::end(&peVar2->field_to_annotations);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&iter), bVar1) {
    local_40 = std::
               _Rb_tree_iterator<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>
               ::operator*(&__end1);
    QPDF::getObject((QPDF *)&local_50,(QPDFObjGen)(this->super_QPDFDocumentHelper).qpdf);
    std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>::
    emplace_back<QPDFObjectHandle>(__return_storage_ptr__,&local_50);
    QPDFObjectHandle::~QPDFObjectHandle(&local_50);
    std::
    _Rb_tree_iterator<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<QPDFFormFieldObjectHelper>
QPDFAcroFormDocumentHelper::getFormFields()
{
    analyze();
    std::vector<QPDFFormFieldObjectHelper> result;
    for (auto const& iter: m->field_to_annotations) {
        result.emplace_back(qpdf.getObject(iter.first));
    }
    return result;
}